

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

void __thiscall
duckdb::StrfTimeFormat::FormatStringNS
          (StrfTimeFormat *this,date_t date,int32_t *data,char *tz_name,char *target)

{
  vector<duckdb::StrTimeSpecifier,_true> *this_00;
  pointer pcVar1;
  size_type sVar2;
  const_reference cVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  size_t tz_len;
  StrfTimeFormat *pSVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar7;
  size_type __n;
  
  if ((this->super_StrTimeFormat).specifiers.
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->super_StrTimeFormat).specifiers.
      super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
  }
  else {
    this_00 = &(this->super_StrTimeFormat).specifiers;
    pvVar7 = &(this->super_StrTimeFormat).literals;
    __n = 0;
    do {
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](pvVar7,__n);
      pcVar1 = (pvVar4->_M_dataplus)._M_p;
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](pvVar7,__n);
      switchD_00b1422a::default(target,pcVar1,pvVar4->_M_string_length);
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](pvVar7,__n);
      sVar2 = pvVar4->_M_string_length;
      cVar3 = vector<bool,_true>::get<true>(&this->is_date_specifier,__n);
      if (cVar3) {
        pSVar6 = (StrfTimeFormat *)this_00;
        pvVar5 = vector<duckdb::StrTimeSpecifier,_true>::operator[](this_00,__n);
        target = WriteDateSpecifier(pSVar6,*pvVar5,date,target + sVar2);
      }
      else {
        if (tz_name == (char *)0x0) {
          tz_len = 0;
        }
        else {
          tz_len = strlen(tz_name);
        }
        pSVar6 = (StrfTimeFormat *)this_00;
        pvVar5 = vector<duckdb::StrTimeSpecifier,_true>::operator[](this_00,__n);
        target = WriteStandardSpecifier(pSVar6,*pvVar5,data,tz_name,tz_len,target + sVar2);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->super_StrTimeFormat).specifiers.
                                 super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                 .
                                 super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->super_StrTimeFormat).specifiers.
                                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                .
                                super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                                ._M_impl.super__Vector_impl_data._M_start));
  }
  pvVar7 = &(this->super_StrTimeFormat).literals;
  pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[](pvVar7,__n);
  pcVar1 = (pvVar4->_M_dataplus)._M_p;
  pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::operator[](pvVar7,__n);
  switchD_00b1422a::default(target,pcVar1,pvVar4->_M_string_length);
  return;
}

Assistant:

void StrfTimeFormat::FormatStringNS(date_t date, int32_t data[8], const char *tz_name, char *target) const {
	D_ASSERT(specifiers.size() + 1 == literals.size());
	idx_t i;
	for (i = 0; i < specifiers.size(); i++) {
		// first copy the current literal
		memcpy(target, literals[i].c_str(), literals[i].size());
		target += literals[i].size();
		// now copy the specifier
		if (is_date_specifier[i]) {
			target = WriteDateSpecifier(specifiers[i], date, target);
		} else {
			auto tz_len = tz_name ? strlen(tz_name) : 0;
			target = WriteStandardSpecifier(specifiers[i], data, tz_name, tz_len, target);
		}
	}
	// copy the final literal into the target
	memcpy(target, literals[i].c_str(), literals[i].size());
}